

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ApiSetAuxdata(Fts5Context *pCtx,void *pPtr,_func_void_void_ptr *xDelete)

{
  uint in_EAX;
  long *plVar1;
  Fts5Context *pFVar2;
  ulong uStack_28;
  int rc;
  
  pFVar2 = pCtx + 0x98;
  do {
    plVar1 = *(long **)pFVar2;
    if (plVar1 == (long *)0x0) {
      uStack_28 = (ulong)in_EAX;
      plVar1 = (long *)sqlite3Fts5MallocZero(&rc,0x20);
      if (plVar1 == (long *)0x0) {
        if (xDelete != (_func_void_void_ptr *)0x0) {
          (*xDelete)(pPtr);
        }
      }
      else {
        *plVar1 = *(long *)(pCtx + 0x90);
        plVar1[3] = *(long *)(pCtx + 0x98);
        *(long **)(pCtx + 0x98) = plVar1;
LAB_001946e0:
        plVar1[2] = (long)xDelete;
        plVar1[1] = (long)pPtr;
        rc = 0;
      }
      return rc;
    }
    if (*plVar1 == *(long *)(pCtx + 0x90)) {
      if ((code *)plVar1[2] != (code *)0x0) {
        (*(code *)plVar1[2])(plVar1[1]);
      }
      goto LAB_001946e0;
    }
    pFVar2 = (Fts5Context *)(plVar1 + 3);
  } while( true );
}

Assistant:

static int fts5ApiSetAuxdata(
  Fts5Context *pCtx,              /* Fts5 context */
  void *pPtr,                     /* Pointer to save as auxdata */
  void(*xDelete)(void*)           /* Destructor for pPtr (or NULL) */
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5Auxdata *pData;

  /* Search through the cursors list of Fts5Auxdata objects for one that
  ** corresponds to the currently executing auxiliary function.  */
  for(pData=pCsr->pAuxdata; pData; pData=pData->pNext){
    if( pData->pAux==pCsr->pAux ) break;
  }

  if( pData ){
    if( pData->xDelete ){
      pData->xDelete(pData->pPtr);
    }
  }else{
    int rc = SQLITE_OK;
    pData = (Fts5Auxdata*)sqlite3Fts5MallocZero(&rc, sizeof(Fts5Auxdata));
    if( pData==0 ){
      if( xDelete ) xDelete(pPtr);
      return rc;
    }
    pData->pAux = pCsr->pAux;
    pData->pNext = pCsr->pAuxdata;
    pCsr->pAuxdata = pData;
  }

  pData->xDelete = xDelete;
  pData->pPtr = pPtr;
  return SQLITE_OK;
}